

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_or(lua_State *L)

{
  int iVar1;
  lua_Unsigned lVar2;
  lua_Unsigned u;
  int narg;
  bool bVar3;
  
  iVar1 = lua_gettop(L);
  if (iVar1 < 1) {
    u = 0;
  }
  else {
    u = 0;
    narg = 1;
    do {
      lVar2 = luaL_checkunsigned(L,narg);
      u = u | lVar2;
      bVar3 = narg != iVar1;
      narg = narg + 1;
    } while (bVar3);
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_or (lua_State *L) {
  int i, n = lua_gettop(L);
  b_uint r = 0;
  for (i = 1; i <= n; i++)
    r |= luaL_checkunsigned(L, i);
  lua_pushunsigned(L, trim(r));
  return 1;
}